

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgtweak.c
# Opt level: O1

void pParamAll(int sel)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    pParam((Param_s *)(&Param[0].row + lVar1),
           (ushort)((ulong)(uint)sel * 0x30 == lVar1) * 0x100 + 0x100,' ',' ');
    lVar1 = lVar1 + 0x30;
  } while (lVar1 != 0x180);
  return;
}

Assistant:

void pParamAll( int sel)
{
	uint	ii;

	// display all settings

	for (ii = 0; ii < sizeof( Param) / sizeof( *Param); ii++)
	{
		if (sel == ii)
			pParam( Param + ii, ATTR_SEL, ' ', ' ');

		else
			pParam( Param + ii, ATTR_DEF, ' ', ' ');
	}
}